

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O0

void test_empty(void)

{
  int iVar1;
  RBTREE in_RAX;
  RBTREE tree;
  RBTREE_CMP_FUNC in_stack_00000408;
  RBTREE_NODE *in_stack_00000410;
  RBTREE *in_stack_00000418;
  
  memset(&stack0xfffffffffffffff8,0,8);
  iVar1 = rbtree_verify((RBTREE *)in_RAX.root);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x68,"%s","rbtree_verify(&tree) == 0");
  iVar1 = rbtree_is_empty((RBTREE *)&stack0xfffffffffffffff8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x69,"%s","rbtree_is_empty(&tree)");
  make_val(tree.root._4_4_);
  iVar1 = rbtree_insert(in_stack_00000418,in_stack_00000410,in_stack_00000408);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6a,"%s","rbtree_insert(&tree, make_val(42), val_cmp) == 0");
  iVar1 = rbtree_verify((RBTREE *)in_RAX.root);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6b,"%s","rbtree_verify(&tree) == 0");
  iVar1 = rbtree_is_empty((RBTREE *)&stack0xfffffffffffffff8);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6c,"%s","!rbtree_is_empty(&tree)");
  clear_tree((RBTREE *)CONCAT44(tree.root._4_4_,tree.root._0_4_));
  iVar1 = rbtree_is_empty((RBTREE *)&stack0xfffffffffffffff8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                 ,0x6e,"%s","rbtree_is_empty(&tree)");
  return;
}

Assistant:

static void
test_empty(void)
{
    RBTREE tree = RBTREE_INITIALIZER;

    TEST_CHECK(rbtree_verify(&tree) == 0);
    TEST_CHECK(rbtree_is_empty(&tree));
    TEST_CHECK(rbtree_insert(&tree, make_val(42), val_cmp) == 0);
    TEST_CHECK(rbtree_verify(&tree) == 0);
    TEST_CHECK(!rbtree_is_empty(&tree));
    clear_tree(&tree);
    TEST_CHECK(rbtree_is_empty(&tree));
}